

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce_load_size.cpp
# Opt level: O0

Status __thiscall spvtools::opt::ReduceLoadSize::Process(ReduceLoadSize *this)

{
  bool bVar1;
  Status SVar2;
  Module *this_00;
  reference this_01;
  anon_class_16_2_3b81a10e local_78;
  function<void_(spvtools::opt::Instruction_*)> local_68;
  reference local_48;
  value_type *func;
  iterator __end2;
  iterator __begin2;
  Module *__range2;
  ReduceLoadSize *pRStack_10;
  bool modified;
  ReduceLoadSize *this_local;
  
  __range2._7_1_ = 0;
  pRStack_10 = this;
  this_00 = Pass::get_module(&this->super_Pass);
  join_0x00000010_0x00000000_ = Module::begin(this_00);
  _func = Module::end(this_00);
  while( true ) {
    bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_,
                       (UptrVectorIterator<spvtools::opt::Function,_false> *)&func);
    if (!bVar1) break;
    this_01 = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                        ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
    local_78.modified = (bool *)((long)&__range2 + 7);
    local_78.this = this;
    local_48 = this_01;
    std::function<void(spvtools::opt::Instruction*)>::
    function<spvtools::opt::ReduceLoadSize::Process()::__0,void>
              ((function<void(spvtools::opt::Instruction*)> *)&local_68,&local_78);
    opt::Function::ForEachInst(this_01,&local_68,false,false);
    std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_68);
    UptrVectorIterator<spvtools::opt::Function,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
  }
  SVar2 = SuccessWithoutChange;
  if ((__range2._7_1_ & 1) != 0) {
    SVar2 = SuccessWithChange;
  }
  return SVar2;
}

Assistant:

Pass::Status ReduceLoadSize::Process() {
  bool modified = false;

  for (auto& func : *get_module()) {
    func.ForEachInst([&modified, this](Instruction* inst) {
      if (inst->opcode() == spv::Op::OpCompositeExtract) {
        if (ShouldReplaceExtract(inst)) {
          modified |= ReplaceExtract(inst);
        }
      }
    });
  }

  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}